

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

bool __thiscall QWizardPage::isComplete(QWizardPage *this)

{
  char cVar1;
  bool bVar2;
  QLineEdit *this_00;
  QAbstractSpinBox *this_01;
  bool bVar3;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = *(long *)(*(long *)&(this->super_QWidget).field_0x8 + 600);
  bVar3 = true;
  if (lVar5 != 0) {
    lVar5 = *(long *)(lVar5 + 8);
    lVar4 = *(long *)(lVar5 + 0x2f8);
    lVar5 = *(long *)(lVar5 + 0x2f0) + lVar4 * 0x80 + -0x20;
    for (lVar4 = lVar4 * -0x80; lVar4 != 0; lVar4 = lVar4 + 0x80) {
      if ((*(QWizardPage **)(lVar5 + -0x60) == this) && (*(char *)(lVar5 + -0x40) == '\x01')) {
        local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
        local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
        local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QObject::property((char *)local_58.data);
        cVar1 = ::QVariant::equals((QVariant *)&local_58);
        if (((cVar1 != '\0') ||
            ((this_00 = QtPrivate::qobject_cast_helper<QLineEdit*,QObject>
                                  (*(QObject **)(lVar5 + -0x38)), this_00 != (QLineEdit *)0x0 &&
             (bVar2 = QLineEdit::hasAcceptableInput(this_00), !bVar2)))) ||
           ((this_01 = (QAbstractSpinBox *)
                       QtPrivate::qobject_cast_helper<QAbstractSpinBox*,QObject>
                                 (*(QObject **)(lVar5 + -0x38)), this_01 != (QAbstractSpinBox *)0x0
            && (bVar2 = QAbstractSpinBox::hasAcceptableInput(this_01), !bVar2)))) {
          ::QVariant::~QVariant((QVariant *)&local_58);
          bVar3 = false;
          break;
        }
        ::QVariant::~QVariant((QVariant *)&local_58);
      }
      lVar5 = lVar5 + -0x80;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QWizardPage::isComplete() const
{
    Q_D(const QWizardPage);

    if (!d->wizard)
        return true;

    const QList<QWizardField> &wizardFields = d->wizard->d_func()->fields;
    const auto end = wizardFields.crend();
    for (auto it = wizardFields.crbegin(); it != end; ++it) {
        const QWizardField &field = *it;
        if (field.page == this && field.mandatory) {
            QVariant value = field.object->property(field.property);
            if (value == field.initialValue)
                return false;

#if QT_CONFIG(lineedit)
            if (QLineEdit *lineEdit = qobject_cast<QLineEdit *>(field.object)) {
                if (!lineEdit->hasAcceptableInput())
                    return false;
            }
#endif
#if QT_CONFIG(spinbox)
            if (QAbstractSpinBox *spinBox = qobject_cast<QAbstractSpinBox *>(field.object)) {
                if (!spinBox->hasAcceptableInput())
                    return false;
            }
#endif
        }
    }
    return true;
}